

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_unroll_indent(yaml_parser_t *parser,ptrdiff_t column)

{
  yaml_token_t **tail;
  yaml_token_t **end;
  size_t sVar1;
  yaml_token_t *pyVar2;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  
  if (parser->flow_level != 0) {
    return 1;
  }
  if (column < parser->indent) {
    tail = &(parser->tokens).tail;
    end = &(parser->tokens).end;
    do {
      sVar1 = (parser->mark).column;
      uStack_5c = (undefined4)sVar1;
      uStack_58 = (undefined4)(sVar1 >> 0x20);
      sVar4 = (parser->mark).index;
      sVar1 = (parser->mark).line;
      local_68 = (undefined4)(sVar4 >> 0x20);
      uStack_64 = (undefined4)sVar1;
      uStack_60 = (undefined4)(sVar1 >> 0x20);
      sVar1 = (parser->mark).column;
      sVar5 = (parser->mark).index;
      sVar6 = (parser->mark).line;
      if ((*tail == *end) &&
         (iVar7 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,end),
         iVar7 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      pyVar2 = (parser->tokens).tail;
      (parser->tokens).tail = pyVar2 + 1;
      pyVar2->type = YAML_BLOCK_END_TOKEN;
      *(undefined4 *)((long)&(pyVar2->start_mark).column + 4) = uStack_58;
      *(ulong *)((long)&(pyVar2->start_mark).index + 4) = CONCAT44(uStack_64,local_68);
      *(ulong *)((long)&(pyVar2->start_mark).line + 4) = CONCAT44(uStack_5c,uStack_60);
      *(undefined8 *)((long)&(pyVar2->data).tag.suffix + 4) = 0;
      *(size_t *)((long)&pyVar2->data + 0x14) = sVar4 << 0x20;
      *(undefined8 *)&pyVar2->field_0x4 = 0;
      *(undefined8 *)((long)&(pyVar2->data).alias.value + 4) = 0;
      (pyVar2->end_mark).index = sVar5;
      (pyVar2->end_mark).line = sVar6;
      (pyVar2->end_mark).column = sVar1;
      piVar3 = (parser->indents).top;
      (parser->indents).top = piVar3 + -1;
      iVar7 = piVar3[-1];
      parser->indent = iVar7;
    } while (column < iVar7);
  }
  return 1;
}

Assistant:

static int
yaml_parser_unroll_indent(yaml_parser_t *parser, ptrdiff_t column)
{
    yaml_token_t token;

    /* In the flow context, do nothing. */

    if (parser->flow_level)
        return 1;

    /* Loop through the indentation levels in the stack. */

    while (parser->indent > column)
    {
        /* Create a token and append it to the queue. */

        TOKEN_INIT(token, YAML_BLOCK_END_TOKEN, parser->mark, parser->mark);

        if (!ENQUEUE(parser, parser->tokens, token))
            return 0;

        /* Pop the indentation level. */

        parser->indent = POP(parser, parser->indents);
    }

    return 1;
}